

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImGuiID *pIVar1;
  int *piVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImGuiTabItem *pIVar5;
  ImGuiWindow *pIVar6;
  ImGuiTabBarSortItem *pIVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  ImGuiID IVar15;
  ImGuiID IVar16;
  ImGuiID IVar17;
  ImGuiID IVar18;
  ImGuiTabItemFlags IVar19;
  ImGuiContext *pIVar20;
  ImGuiContext *pIVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  int iVar25;
  ImGuiTabItem *pIVar26;
  ImGuiTabBarSortItem *__dest;
  char *__dest_00;
  int iVar27;
  long lVar28;
  ulong uVar29;
  float *pfVar30;
  char *pcVar31;
  ulong uVar32;
  int iVar33;
  uint uVar34;
  ImGuiTabItem *pIVar35;
  ulong uVar36;
  float *pfVar37;
  int iVar38;
  uint uVar39;
  long lVar40;
  ImVec2 IVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  ImGuiTabItem item_tmp;
  float local_c4;
  ImVec4 local_98;
  undefined8 local_80;
  ImVec4 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  pIVar21 = GImGui;
  tab_bar->WantLayout = false;
  iVar38 = (tab_bar->Tabs).Size;
  if (iVar38 < 1) {
    uVar29 = 0;
  }
  else {
    lVar28 = 0;
    uVar32 = 0;
    uVar29 = 0;
    do {
      pIVar35 = (tab_bar->Tabs).Data;
      pIVar1 = (ImGuiID *)((long)&pIVar35->ID + lVar28);
      if (*(int *)((long)&pIVar35->LastFrameVisible + lVar28) < tab_bar->PrevFrameVisible) {
        if (*pIVar1 == tab_bar->SelectedTabId) {
          tab_bar->SelectedTabId = 0;
        }
      }
      else {
        iVar33 = (int)uVar29;
        if (uVar32 != uVar29) {
          if (iVar38 <= iVar33) goto LAB_001463ce;
          IVar15 = pIVar1[0];
          IVar16 = pIVar1[1];
          IVar17 = pIVar1[2];
          IVar18 = pIVar1[3];
          fVar42 = (float)pIVar1[5];
          fVar48 = (float)pIVar1[6];
          fVar43 = (float)pIVar1[7];
          piVar2 = &pIVar35[iVar33].NameOffset;
          *piVar2 = pIVar1[4];
          piVar2[1] = (int)fVar42;
          piVar2[2] = (int)fVar48;
          piVar2[3] = (int)fVar43;
          pIVar35 = pIVar35 + iVar33;
          pIVar35->ID = IVar15;
          pIVar35->Flags = IVar16;
          pIVar35->LastFrameVisible = IVar17;
          pIVar35->LastFrameSelected = IVar18;
          iVar38 = (tab_bar->Tabs).Size;
        }
        uVar29 = (ulong)(iVar33 + 1);
      }
      uVar32 = uVar32 + 1;
      lVar28 = lVar28 + 0x20;
    } while ((long)uVar32 < (long)iVar38);
  }
  iVar33 = (int)uVar29;
  if (iVar38 != iVar33) {
    iVar38 = (tab_bar->Tabs).Capacity;
    if (iVar38 < iVar33) {
      if (iVar38 == 0) {
        iVar38 = 8;
      }
      else {
        iVar38 = iVar38 / 2 + iVar38;
      }
      if (iVar38 <= iVar33) {
        iVar38 = iVar33;
      }
      pIVar26 = (ImGuiTabItem *)MemAlloc((long)iVar38 << 5);
      pIVar35 = (tab_bar->Tabs).Data;
      if (pIVar35 != (ImGuiTabItem *)0x0) {
        memcpy(pIVar26,pIVar35,(long)(tab_bar->Tabs).Size << 5);
        MemFree((tab_bar->Tabs).Data);
      }
      (tab_bar->Tabs).Data = pIVar26;
      (tab_bar->Tabs).Capacity = iVar38;
    }
    (tab_bar->Tabs).Size = iVar33;
  }
  local_c4 = (float)tab_bar->NextSelectedTabId;
  if (local_c4 != 0.0) {
    tab_bar->SelectedTabId = (ImGuiID)local_c4;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    if (0 < iVar33) {
      pIVar35 = (tab_bar->Tabs).Data;
      do {
        if (pIVar35->ID == tab_bar->ReorderRequestTabId) {
          iVar38 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar35);
          uVar34 = iVar38 + tab_bar->ReorderRequestDir;
          if ((-1 < (int)uVar34) && ((int)uVar34 < (tab_bar->Tabs).Size)) {
            pIVar5 = (tab_bar->Tabs).Data;
            local_78.x = (float)pIVar35->ID;
            local_78.y = (float)pIVar35->Flags;
            local_78.z = (float)pIVar35->LastFrameVisible;
            local_78.w = (float)pIVar35->LastFrameSelected;
            local_68._0_4_ = pIVar35->NameOffset;
            local_68._4_4_ = pIVar35->Offset;
            uStack_60._0_4_ = pIVar35->Width;
            uStack_60._4_4_ = pIVar35->WidthContents;
            pIVar26 = pIVar5 + uVar34;
            IVar15 = pIVar26->ID;
            IVar19 = pIVar26->Flags;
            iVar38 = pIVar26->LastFrameVisible;
            iVar33 = pIVar26->LastFrameSelected;
            pIVar26 = pIVar5 + uVar34;
            fVar42 = pIVar26->Offset;
            uVar10 = *(undefined8 *)(&pIVar26->NameOffset + 2);
            pIVar35->NameOffset = pIVar26->NameOffset;
            pIVar35->Offset = fVar42;
            *(undefined8 *)&pIVar35->Width = uVar10;
            pIVar35->ID = IVar15;
            pIVar35->Flags = IVar19;
            pIVar35->LastFrameVisible = iVar38;
            pIVar35->LastFrameSelected = iVar33;
            pIVar35 = pIVar5 + uVar34;
            pIVar35->ID = (ImGuiID)local_78.x;
            pIVar35->Flags = (ImGuiTabItemFlags)local_78.y;
            pIVar35->LastFrameVisible = (int)local_78.z;
            pIVar35->LastFrameSelected = (int)local_78.w;
            pIVar35 = pIVar5 + uVar34;
            pIVar35->NameOffset = (undefined4)local_68;
            pIVar35->Offset = (float)local_68._4_4_;
            *(undefined8 *)(&pIVar35->NameOffset + 2) = uStack_60;
            if (pIVar5[uVar34].ID == tab_bar->SelectedTabId) {
              local_c4 = (float)pIVar5[uVar34].ID;
            }
          }
          if ((tab_bar->Flags & 0x400000) != 0) {
            MarkIniSettingsDirty();
          }
          break;
        }
        pIVar35 = pIVar35 + 1;
        uVar29 = uVar29 - 1;
      } while (uVar29 != 0);
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar20 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar6 = GImGui->CurrentWindow;
    fVar42 = (GImGui->Style).FramePadding.y;
    fVar48 = GImGui->FontSize;
    IVar41 = (pIVar6->DC).CursorPos;
    fVar43 = (tab_bar->BarRect).Min.y;
    (pIVar6->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar42;
    (pIVar6->DC).CursorPos.y = fVar43;
    (tab_bar->BarRect).Min.x = fVar48 + fVar42 + (tab_bar->BarRect).Min.x;
    local_78.x = (pIVar20->Style).Colors[0].x;
    local_78.y = (pIVar20->Style).Colors[0].y;
    uVar11 = (pIVar20->Style).Colors[0].z;
    uVar12 = (pIVar20->Style).Colors[0].w;
    local_78.w = (float)uVar12 * 0.5;
    local_78.z = (float)uVar11;
    PushStyleColor(0,&local_78);
    local_98.x = 0.0;
    local_98.y = 0.0;
    local_98.z = 0.0;
    local_98.w = 0.0;
    PushStyleColor(0x15,&local_98);
    bVar22 = BeginCombo("##v",(char *)0x0,0x40);
    PopStyleColor(2);
    if (bVar22) {
      if (0 < (tab_bar->Tabs).Size) {
        lVar28 = 0;
        lVar40 = 0;
        pfVar37 = (float *)0x0;
        do {
          pIVar35 = (tab_bar->Tabs).Data;
          iVar38 = *(int *)((long)&pIVar35->NameOffset + lVar28);
          if (((long)iVar38 == -1) || ((tab_bar->TabsNames).Buf.Size <= iVar38)) goto LAB_00146390;
          pfVar30 = (float *)((long)&pIVar35->ID + lVar28);
          local_98.x = 0.0;
          local_98.y = 0.0;
          bVar22 = Selectable((tab_bar->TabsNames).Buf.Data + iVar38,
                              (float)tab_bar->SelectedTabId == *pfVar30,0,(ImVec2 *)&local_98);
          if (bVar22) {
            pfVar37 = pfVar30;
          }
          lVar40 = lVar40 + 1;
          lVar28 = lVar28 + 0x20;
        } while (lVar40 < (tab_bar->Tabs).Size);
        EndPopup();
        (pIVar6->DC).CursorPos = IVar41;
        if (pfVar37 != (float *)0x0) {
          local_c4 = *pfVar37;
          tab_bar->SelectedTabId = (ImGuiID)local_c4;
        }
        goto LAB_00145a2a;
      }
      EndPopup();
    }
    (pIVar6->DC).CursorPos = IVar41;
  }
LAB_00145a2a:
  uVar39 = (tab_bar->Tabs).Size;
  iVar38 = (pIVar21->TabSortByWidthBuffer).Capacity;
  uVar34 = uVar39;
  if (iVar38 < (int)uVar39) {
    if (iVar38 == 0) {
      uVar34 = 8;
    }
    else {
      uVar34 = iVar38 / 2 + iVar38;
    }
    if ((int)uVar34 <= (int)uVar39) {
      uVar34 = uVar39;
    }
    __dest = (ImGuiTabBarSortItem *)MemAlloc((long)(int)uVar34 << 3);
    pIVar7 = (pIVar21->TabSortByWidthBuffer).Data;
    if (pIVar7 != (ImGuiTabBarSortItem *)0x0) {
      memcpy(__dest,pIVar7,(long)(pIVar21->TabSortByWidthBuffer).Size << 3);
      MemFree((pIVar21->TabSortByWidthBuffer).Data);
    }
    (pIVar21->TabSortByWidthBuffer).Data = __dest;
    (pIVar21->TabSortByWidthBuffer).Capacity = uVar34;
    uVar34 = (tab_bar->Tabs).Size;
  }
  uVar29 = (ulong)uVar34;
  (pIVar21->TabSortByWidthBuffer).Size = uVar39;
  if ((int)uVar34 < 1) {
    bVar22 = true;
    pfVar37 = (float *)0x0;
    fVar42 = 0.0;
  }
  else {
    fVar42 = 0.0;
    lVar28 = 0;
    lVar40 = 0;
    pfVar37 = (float *)0x0;
    bVar22 = false;
    do {
      pIVar35 = (tab_bar->Tabs).Data;
      if (*(int *)((long)&pIVar35->LastFrameVisible + lVar28) < tab_bar->PrevFrameVisible) {
        __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_widgets.cpp"
                      ,0x18df,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      if ((pfVar37 == (float *)0x0) ||
         ((int)pfVar37[3] < *(int *)((long)&pIVar35->LastFrameSelected + lVar28))) {
        pfVar37 = (float *)((long)&pIVar35->ID + lVar28);
      }
      if (*(ImGuiID *)((long)&pIVar35->ID + lVar28) == tab_bar->SelectedTabId) {
        bVar22 = true;
      }
      iVar38 = *(int *)((long)&pIVar35->NameOffset + lVar28);
      if (((long)iVar38 == -1) || ((tab_bar->TabsNames).Buf.Size <= iVar38)) {
LAB_00146390:
        __assert_fail("tab->NameOffset != -1 && tab->NameOffset < TabsNames.Buf.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_internal.h"
                      ,0x55e,"const char *ImGuiTabBar::GetTabName(const ImGuiTabItem *) const");
      }
      IVar41 = TabItemCalcSize((tab_bar->TabsNames).Buf.Data + iVar38,
                               (*(uint *)((long)&pIVar35->Flags + lVar28) >> 0x14 & 1) == 0);
      fVar48 = IVar41.x;
      *(float *)((long)&pIVar35->WidthContents + lVar28) = fVar48;
      if (lVar40 == 0) {
        fVar43 = 0.0;
      }
      else {
        fVar43 = (pIVar21->Style).ItemInnerSpacing.x;
      }
      uVar39 = (pIVar21->TabSortByWidthBuffer).Size;
      if ((int)uVar39 <= lVar40) goto LAB_00146371;
      fVar42 = fVar42 + fVar43 + fVar48;
      pIVar7 = (pIVar21->TabSortByWidthBuffer).Data;
      pIVar7[lVar40].Index = (int)lVar40;
      pIVar7[lVar40].Width = fVar48;
      lVar40 = lVar40 + 1;
      uVar29 = (ulong)(tab_bar->Tabs).Size;
      lVar28 = lVar28 + 0x20;
    } while (lVar40 < (long)uVar29);
    bVar22 = !bVar22;
  }
  fVar48 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  fVar42 = (float)(-(uint)(fVar48 < fVar42) & (uint)(fVar42 - fVar48));
  uVar34 = (uint)uVar29;
  if ((fVar42 <= 0.0) || ((tab_bar->Flags & 0x40) == 0)) {
    if ((int)uVar34 < 1) goto LAB_00145df9;
    fVar42 = GImGui->FontSize * 20.0;
    pIVar35 = (tab_bar->Tabs).Data;
    lVar28 = 0;
    do {
      fVar48 = *(float *)((long)&pIVar35->WidthContents + lVar28);
      if (fVar42 <= fVar48) {
        fVar48 = fVar42;
      }
      *(float *)((long)&pIVar35->Width + lVar28) = fVar48;
      lVar28 = lVar28 + 0x20;
    } while ((uVar29 & 0xffffffff) << 5 != lVar28);
LAB_00145db1:
    uVar34 = (uint)uVar29;
    fVar42 = (pIVar21->Style).ItemInnerSpacing.x;
    uVar29 = uVar29 & 0xffffffff;
    pfVar30 = &((tab_bar->Tabs).Data)->Width;
    fVar48 = 0.0;
    do {
      pfVar30[-1] = fVar48;
      if ((local_c4 == 0.0) &&
         (local_c4 = (float)((ImGuiTabItem *)(pfVar30 + -6))->ID,
         (float)pIVar21->NavJustMovedToId != local_c4)) {
        local_c4 = 0.0;
      }
      fVar48 = fVar48 + *pfVar30 + fVar42;
      pfVar30 = pfVar30 + 8;
      uVar29 = uVar29 - 1;
    } while (uVar29 != 0);
  }
  else {
    if (1 < (int)uVar34) {
      qsort((pIVar21->TabSortByWidthBuffer).Data,(long)(int)uVar39,8,TabBarSortItemComparer);
    }
    uVar34 = (tab_bar->Tabs).Size;
    uVar29 = (ulong)uVar34;
    uVar32 = 1;
    do {
      iVar38 = (int)uVar32;
      if ((int)uVar34 <= iVar38) break;
      uVar39 = (pIVar21->TabSortByWidthBuffer).Size;
      if ((long)(int)uVar39 < 1) goto LAB_00146371;
      uVar36 = uVar32 & 0xffffffff;
      if (iVar38 <= (int)uVar39) {
        uVar36 = (ulong)uVar39;
      }
      uVar32 = (ulong)iVar38;
      lVar28 = uVar32 << 0x20;
      do {
        if (uVar36 == uVar32) goto LAB_00146371;
        pIVar7 = (pIVar21->TabSortByWidthBuffer).Data;
        fVar48 = pIVar7->Width;
        if ((fVar48 != pIVar7[uVar32].Width) || (NAN(fVar48) || NAN(pIVar7[uVar32].Width))) {
          if ((int)uVar39 <= (int)uVar32) goto LAB_00146371;
          fVar48 = fVar48 - *(float *)((long)&pIVar7->Width + (lVar28 >> 0x1d));
          goto LAB_00145d0c;
        }
        uVar32 = uVar32 + 1;
        lVar28 = lVar28 + 0x100000000;
      } while (uVar34 != (uint)uVar32);
      fVar48 = fVar48 + -1.0;
      uVar32 = uVar29;
LAB_00145d0c:
      fVar46 = (float)(int)uVar32;
      fVar43 = fVar42 / fVar46;
      if (fVar48 <= fVar43) {
        fVar43 = fVar48;
      }
      if (0 < (int)uVar32) {
        uVar36 = 0;
        do {
          if ((long)(int)uVar39 == uVar36) goto LAB_00146371;
          pIVar7[uVar36].Width = pIVar7[uVar36].Width - fVar43;
          uVar36 = uVar36 + 1;
        } while ((uVar32 & 0xffffffff) != uVar36);
      }
      fVar42 = fVar42 - fVar43 * fVar46;
    } while (0.0 < fVar42);
    if (0 < (int)uVar34) {
      uVar39 = (pIVar21->TabSortByWidthBuffer).Size;
      uVar36 = 0;
      uVar32 = (ulong)uVar39;
      if ((int)uVar39 < 1) {
        uVar32 = uVar36;
      }
      do {
        if (uVar32 == uVar36) goto LAB_00146371;
        pIVar7 = (pIVar21->TabSortByWidthBuffer).Data;
        iVar38 = pIVar7[uVar36].Index;
        if ((int)uVar34 <= iVar38) goto LAB_001463ce;
        (tab_bar->Tabs).Data[iVar38].Width = (float)(int)pIVar7[uVar36].Width;
        uVar36 = uVar36 + 1;
      } while (uVar29 != uVar36);
      goto LAB_00145db1;
    }
LAB_00145df9:
    fVar42 = (pIVar21->Style).ItemInnerSpacing.x;
    fVar48 = 0.0;
  }
  fVar48 = (float)(-(uint)(0.0 <= fVar48 - fVar42) & (uint)(fVar48 - fVar42));
  tab_bar->OffsetMax = fVar48;
  tab_bar->OffsetNextTab = 0.0;
  pIVar20 = GImGui;
  fVar42 = (tab_bar->BarRect).Max.x;
  if (((1 < (int)uVar34) && (fVar43 = (tab_bar->BarRect).Min.x, fVar42 - fVar43 < fVar48)) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar6 = GImGui->CurrentWindow;
    fVar49 = GImGui->FontSize + -2.0;
    fVar48 = (GImGui->Style).FramePadding.y;
    local_58.y = fVar48 + fVar48 + GImGui->FontSize;
    local_58.x = fVar49;
    uStack_50 = 0;
    local_48 = ZEXT416((uint)fVar49);
    fVar49 = fVar49 + fVar49;
    IVar41 = (pIVar6->DC).CursorPos;
    fVar48 = (tab_bar->BarRect).Max.y;
    fVar47 = IVar41.x;
    fVar46 = IVar41.y;
    bVar9 = fVar46 < (tab_bar->BarRect).Min.y;
    bVar8 = fVar42 < fVar49 + fVar47;
    if ((fVar48 < fVar46 || (fVar47 < fVar43 || bVar9)) || bVar8) {
      local_78.y = fVar48 + 0.0;
      local_78.x = (GImGui->Style).ItemInnerSpacing.x + fVar42;
      PushClipRect(&(tab_bar->BarRect).Min,(ImVec2 *)&local_78,true);
    }
    local_78.x = (pIVar20->Style).Colors[0].x;
    local_78.y = (pIVar20->Style).Colors[0].y;
    uVar13 = (pIVar20->Style).Colors[0].z;
    uVar14 = (pIVar20->Style).Colors[0].w;
    local_78.w = (float)uVar14 * 0.5;
    local_78.z = (float)uVar13;
    PushStyleColor(0,&local_78);
    local_98.x = 0.0;
    local_98.y = 0.0;
    local_98.z = 0.0;
    local_98.w = 0.0;
    PushStyleColor(0x15,&local_98);
    local_80._0_4_ = (pIVar20->IO).KeyRepeatDelay;
    local_80._4_4_ = (pIVar20->IO).KeyRepeatRate;
    (pIVar20->IO).KeyRepeatDelay = 0.25;
    (pIVar20->IO).KeyRepeatRate = 0.2;
    fVar42 = (tab_bar->BarRect).Min.y;
    (pIVar6->DC).CursorPos.x = (tab_bar->BarRect).Max.x - fVar49;
    (pIVar6->DC).CursorPos.y = fVar42;
    bVar23 = ArrowButtonEx("##<",0,local_58,5);
    fVar42 = (tab_bar->BarRect).Min.y;
    (pIVar6->DC).CursorPos.x = (float)local_48._0_4_ + ((tab_bar->BarRect).Max.x - fVar49);
    (pIVar6->DC).CursorPos.y = fVar42;
    bVar24 = ArrowButtonEx("##>",1,local_58,5);
    iVar38 = -(uint)bVar23;
    if (bVar24) {
      iVar38 = 1;
    }
    PopStyleColor(2);
    (pIVar20->IO).KeyRepeatDelay = (float)(undefined4)local_80;
    (pIVar20->IO).KeyRepeatRate = (float)local_80._4_4_;
    if ((fVar48 < fVar46 || (fVar47 < fVar43 || bVar9)) || bVar8) {
      PopClipRect();
    }
    if (((iVar38 != 0) && (tab_bar->SelectedTabId != 0)) &&
       (lVar28 = (long)(tab_bar->Tabs).Size, 0 < lVar28)) {
      pIVar35 = (tab_bar->Tabs).Data;
      do {
        if (pIVar35->ID == tab_bar->SelectedTabId) {
          iVar25 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar35);
          iVar38 = iVar38 + iVar25;
          iVar33 = (tab_bar->Tabs).Size;
          iVar27 = iVar25;
          if (iVar38 < iVar33) {
            iVar27 = iVar38;
          }
          if (iVar38 < 0) {
            iVar27 = iVar25;
          }
          if (iVar33 <= iVar27) goto LAB_001463ce;
          pIVar35 = (tab_bar->Tabs).Data;
          (pIVar6->DC).CursorPos = IVar41;
          fVar42 = (tab_bar->BarRect).Max.x - (fVar49 + 1.0);
          (tab_bar->BarRect).Max.x = fVar42;
          if (pIVar35 != (ImGuiTabItem *)0x0) {
            local_c4 = (float)pIVar35[iVar27].ID;
            tab_bar->SelectedTabId = (ImGuiID)local_c4;
          }
          goto LAB_00146092;
        }
        pIVar35 = pIVar35 + 1;
        lVar28 = lVar28 + -1;
      } while (lVar28 != 0);
    }
    (pIVar6->DC).CursorPos = IVar41;
    fVar42 = (tab_bar->BarRect).Max.x - (fVar49 + 1.0);
    (tab_bar->BarRect).Max.x = fVar42;
  }
LAB_00146092:
  if (bVar22) {
    tab_bar->SelectedTabId = 0;
  }
  else {
    fVar48 = (float)tab_bar->SelectedTabId;
    if (fVar48 != 0.0) goto LAB_001460bd;
  }
  fVar48 = 0.0;
  if ((tab_bar->NextSelectedTabId == 0) && (fVar48 = 0.0, pfVar37 != (float *)0x0)) {
    local_c4 = *pfVar37;
    tab_bar->SelectedTabId = (ImGuiID)local_c4;
    fVar48 = local_c4;
  }
LAB_001460bd:
  tab_bar->VisibleTabId = (ImGuiID)fVar48;
  tab_bar->VisibleTabWasSubmitted = false;
  if ((local_c4 != 0.0) && (lVar28 = (long)(tab_bar->Tabs).Size, 0 < lVar28)) {
    pIVar35 = (tab_bar->Tabs).Data;
    do {
      if ((float)pIVar35->ID == local_c4) {
        fVar48 = GImGui->FontSize;
        iVar38 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar35);
        fVar43 = fVar48;
        if (iVar38 < 1) {
          fVar43 = -0.0;
        }
        fVar43 = pIVar35->Offset - fVar43;
        if ((tab_bar->Tabs).Size <= iVar38 + 1) {
          fVar48 = 1.0;
        }
        fVar48 = pIVar35->Offset + pIVar35->Width + fVar48;
        tab_bar->ScrollingTargetDistToVisibility = 0.0;
        if (tab_bar->ScrollingTarget <= fVar43) {
          fVar42 = (tab_bar->BarRect).Max.x;
          fVar47 = fVar42 - (tab_bar->BarRect).Min.x;
          fVar46 = fVar48 - fVar47;
          if (fVar46 <= tab_bar->ScrollingTarget) break;
          fVar48 = (fVar43 - fVar47) - tab_bar->ScrollingAnim;
        }
        else {
          fVar42 = (tab_bar->BarRect).Max.x;
          fVar48 = tab_bar->ScrollingAnim - fVar48;
          fVar46 = fVar43;
        }
        tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar48) & (uint)fVar48);
        tab_bar->ScrollingTarget = fVar46;
        break;
      }
      pIVar35 = pIVar35 + 1;
      lVar28 = lVar28 + -1;
    } while (lVar28 != 0);
  }
  fVar42 = tab_bar->OffsetMax - (fVar42 - (tab_bar->BarRect).Min.x);
  uVar3 = tab_bar->ScrollingAnim;
  uVar4 = tab_bar->ScrollingTarget;
  auVar44._4_4_ = uVar4;
  auVar44._0_4_ = uVar3;
  auVar44._8_8_ = 0;
  auVar45._4_4_ = fVar42;
  auVar45._0_4_ = fVar42;
  auVar45._8_4_ = fVar42;
  auVar45._12_4_ = fVar42;
  auVar45 = minps(auVar44,auVar45);
  fVar42 = (float)(-(uint)(0.0 <= auVar45._0_4_) & (uint)auVar45._0_4_);
  fVar48 = (float)(-(uint)(0.0 <= auVar45._4_4_) & (uint)auVar45._4_4_);
  tab_bar->ScrollingAnim = fVar42;
  tab_bar->ScrollingTarget = fVar48;
  if ((fVar42 != fVar48) || (NAN(fVar42) || NAN(fVar48))) {
    fVar43 = pIVar21->FontSize;
    fVar46 = fVar43 * 70.0;
    uVar34 = -(uint)(fVar46 <= tab_bar->ScrollingSpeed);
    fVar47 = ABS(fVar48 - fVar42) / 0.3;
    fVar46 = (float)(~uVar34 & (uint)fVar46 | (uint)tab_bar->ScrollingSpeed & uVar34);
    uVar34 = -(uint)(fVar47 <= fVar46);
    fVar47 = (float)(~uVar34 & (uint)fVar47 | uVar34 & (uint)fVar46);
    tab_bar->ScrollingSpeed = fVar47;
    fVar46 = fVar48;
    if ((pIVar21->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar43 * 10.0)) {
      fVar47 = fVar47 * (pIVar21->IO).DeltaTime;
      if (fVar48 <= fVar42) {
        fVar46 = fVar42;
        if (fVar48 < fVar42) {
          fVar42 = fVar42 - fVar47;
          uVar34 = -(uint)(fVar48 <= fVar42);
          fVar46 = (float)((uint)fVar42 & uVar34 | ~uVar34 & (uint)fVar48);
        }
      }
      else {
        fVar46 = fVar42 + fVar47;
        if (fVar48 <= fVar46) {
          fVar46 = fVar48;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar46;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  if ((tab_bar->Flags & 0x100000) == 0) {
    if ((tab_bar->TabsNames).Buf.Capacity < 0) {
      __dest_00 = (char *)MemAlloc(0);
      pcVar31 = (tab_bar->TabsNames).Buf.Data;
      if (pcVar31 != (char *)0x0) {
        memcpy(__dest_00,pcVar31,(long)(tab_bar->TabsNames).Buf.Size);
        MemFree((tab_bar->TabsNames).Buf.Data);
      }
      (tab_bar->TabsNames).Buf.Data = __dest_00;
      (tab_bar->TabsNames).Buf.Capacity = 0;
    }
    (tab_bar->TabsNames).Buf.Size = 0;
  }
  return;
LAB_00146371:
  pcVar31 = "T &ImVector<ImGuiTabBarSortItem>::operator[](int) [T = ImGuiTabBarSortItem]";
  goto LAB_00146386;
LAB_001463ce:
  pcVar31 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
LAB_00146386:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.h"
                ,0x4d7,pcVar31);
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect
    int tab_dst_n = 0;
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible)
        {
            if (tab->ID == tab_bar->SelectedTabId)
                tab_bar->SelectedTabId = 0;
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId))
        {
            //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
            int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
            if (tab2_order >= 0 && tab2_order < tab_bar->Tabs.Size)
            {
                ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
                ImGuiTabItem item_tmp = *tab1;
                *tab1 = *tab2;
                *tab2 = item_tmp;
                if (tab2->ID == tab_bar->SelectedTabId)
                    scroll_track_selected_tab_id = tab2->ID;
                tab1 = tab2 = NULL;
            }
            if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
                MarkIniSettingsDirty();
        }
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    ImVector<ImGuiTabBarSortItem>& width_sort_buffer = g.TabSortByWidthBuffer;
    width_sort_buffer.resize(tab_bar->Tabs.Size);

    // Compute ideal widths
    float width_total_contents = 0.0f;
    ImGuiTabItem* most_recently_selected_tab = NULL;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        tab->WidthContents = TabItemCalcSize(tab_name, (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true).x;

        width_total_contents += (tab_n > 0 ? g.Style.ItemInnerSpacing.x : 0.0f) + tab->WidthContents;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        width_sort_buffer[tab_n].Index = tab_n;
        width_sort_buffer[tab_n].Width = tab->WidthContents;
    }

    // Compute width
    const float width_avail = tab_bar->BarRect.GetWidth();
    float width_excess = (width_avail < width_total_contents) ? (width_total_contents - width_avail) : 0.0f;
    if (width_excess > 0.0f && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown))
    {
        // If we don't have enough room, resize down the largest tabs first
        if (tab_bar->Tabs.Size > 1)
            ImQsort(width_sort_buffer.Data, (size_t)width_sort_buffer.Size, sizeof(ImGuiTabBarSortItem), TabBarSortItemComparer);
        int tab_count_same_width = 1;
        while (width_excess > 0.0f && tab_count_same_width < tab_bar->Tabs.Size)
        {
            while (tab_count_same_width < tab_bar->Tabs.Size && width_sort_buffer[0].Width == width_sort_buffer[tab_count_same_width].Width)
                tab_count_same_width++;
            float width_to_remove_per_tab_max = (tab_count_same_width < tab_bar->Tabs.Size) ? (width_sort_buffer[0].Width - width_sort_buffer[tab_count_same_width].Width) : (width_sort_buffer[0].Width - 1.0f);
            float width_to_remove_per_tab = ImMin(width_excess / tab_count_same_width, width_to_remove_per_tab_max);
            for (int tab_n = 0; tab_n < tab_count_same_width; tab_n++)
                width_sort_buffer[tab_n].Width -= width_to_remove_per_tab;
            width_excess -= width_to_remove_per_tab * tab_count_same_width;
        }
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            tab_bar->Tabs[width_sort_buffer[tab_n].Index].Width = (float)(int)width_sort_buffer[tab_n].Width;
    }
    else
    {
        const float tab_max_width = TabBarCalcMaxTabWidth();
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            tab->Width = ImMin(tab->WidthContents, tab_max_width);
        }
    }

    // Layout all active tabs
    float offset_x = 0.0f;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        tab->Offset = offset_x;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;
        offset_x += tab->Width + g.Style.ItemInnerSpacing.x;
    }
    tab_bar->OffsetMax = ImMax(offset_x - g.Style.ItemInnerSpacing.x, 0.0f);
    tab_bar->OffsetNextTab = 0.0f;

    // Horizontal scrolling buttons
    const bool scrolling_buttons = (tab_bar->OffsetMax > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll);
    if (scrolling_buttons)
        if (ImGuiTabItem* tab_to_select = TabBarScrollingButtons(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);
}